

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app3.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float *item;
  float *pfVar1;
  pointer pfVar2;
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> v;
  allocator_type local_31;
  vector<float,_std::allocator<float>_> local_30;
  float local_14 [3];
  
  local_14[0] = 10.1;
  local_14[1] = 20.2;
  local_14[2] = 30.3;
  __l._M_len = 3;
  __l._M_array = local_14;
  std::vector<float,_std::allocator<float>_>::vector(&local_30,__l,&local_31);
  print<std::vector<float,std::allocator<float>>>(&local_30);
  for (pfVar1 = local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar1 != local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar1 = pfVar1 + 1) {
    *pfVar1 = *pfVar1 + 3.5;
  }
  print<std::vector<float,std::allocator<float>>>(&local_30);
  for (pfVar2 = local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar2 != local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar2 = pfVar2 + 1) {
    *pfVar2 = *pfVar2 * *pfVar2;
  }
  print<std::vector<float,std::allocator<float>>>(&local_30);
  if (local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    auto increment_by5 = Increment{5};
//    auto increment_by10 = Increment{10};
////    increment.operator()();
//    auto i = 100;
//    for(int k=0; k<3; ++k)
//        increment_by5(i);
//    cout << i << endl;

    auto v = vector<float>{10.1, 20.2, 30.3};
    print(v);

//    by_what = 3;
    transform(v, Increment<float>{3.5f});
    print(v);

//    transform(v, Square{});
    auto square = [](auto& item) { item = item*item; };
    transform(v, square);
    print(v);

    return 0;
}